

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

char * get_line(void)

{
  char cVar1;
  byte bVar2;
  ifdef_state *piVar3;
  file_info *pfVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ifdef_state *piVar9;
  size_t sVar10;
  char *pcVar11;
  ushort **ppuVar12;
  byte *pbVar13;
  char *pcVar14;
  long lVar15;
  char **ppcVar16;
  void *t1;
  char var_name [80];
  char local_88 [88];
  
LAB_001129bf:
  do {
    while ((saw_eof != '\0' || (iVar7 = getc((FILE *)input_file->file), iVar7 == -1))) {
      pfVar4 = input_file;
      piVar9 = ifdef;
      if (input_file->next == (file_info *)0x0) {
        if (line != (char *)0x0) {
          free(line);
        }
        cptr = (char *)0x0;
        line = (char *)0x0;
        saw_eof = '\x01';
        return (char *)0x0;
      }
      while ((piVar9 != (ifdef_state *)0x0 && (piVar9->file == input_file))) {
        error(piVar9->lineno,(char *)0x0,(char *)0x0,"No %%endif for %%if");
        piVar3 = ifdef->next;
        ifdef = piVar3;
        free(piVar9);
        piVar9 = piVar3;
      }
      fclose((FILE *)input_file->file);
      free(input_file->name);
      input_file = input_file->next;
      free(pfVar4);
    }
    if ((line == (char *)0x0) || (linesize != 0x65)) {
      if (line != (char *)0x0) {
        free(line);
      }
      linesize = 0x65;
      line = (char *)malloc(0x65);
      if (line == (char *)0x0) {
        no_space();
      }
    }
    pcVar11 = line;
    input_file->lineno = input_file->lineno + 1;
    *pcVar11 = (char)iVar7;
    if ((char)iVar7 == '\n') {
      lVar15 = 0;
    }
    else {
      lVar6 = 1;
      do {
        lVar15 = lVar6;
        if ((long)linesize <= lVar15 + 1) {
          linesize = linesize + 100;
          line = (char *)realloc(line,(ulong)(uint)linesize);
          if (line == (char *)0x0) {
            no_space();
          }
        }
        iVar7 = getc((FILE *)input_file->file);
        if (iVar7 == -1) {
          saw_eof = '\x01';
          line[lVar15] = '\n';
          break;
        }
        line[lVar15] = (char)iVar7;
        lVar6 = lVar15 + 1;
      } while ((char)iVar7 != '\n');
    }
    line[lVar15 + 1] = '\0';
    pcVar11 = line;
    iVar7 = strncmp(line,"%ifdef ",7);
    if ((iVar7 != 0) && (iVar7 = strncmp(pcVar11,"%ifndef ",8), iVar7 != 0)) {
      iVar7 = strncmp(pcVar11,"%endif",6);
      piVar9 = ifdef;
      if (iVar7 == 0) {
        if ((ifdef == (ifdef_state *)0x0) || (ifdef->file != input_file)) {
          error(input_file->lineno,(char *)0x0,(char *)0x0,
                "There is no corresponding %%ifdef for %%endif");
        }
        else if (ifdef->nested == 0) {
          ifdef = ifdef->next;
          free(piVar9);
        }
        else {
          ifdef->nested = ifdef->nested + -1;
        }
      }
      else if ((ifdef == (ifdef_state *)0x0) || (ifdef->state == 0)) {
        iVar7 = strncmp(pcVar11,"%include ",9);
        if (iVar7 == 0) {
          ppuVar12 = __ctype_b_loc();
          pcVar14 = pcVar11 + 8;
          pbVar5 = (byte *)(pcVar11 + 10);
          do {
            pbVar13 = pbVar5;
            uVar8 = (ulong)pcVar14[1];
            pcVar14 = pcVar14 + 1;
            pbVar5 = pbVar13 + 1;
          } while ((*(byte *)((long)*ppuVar12 + uVar8 * 2 + 1) & 0x20) != 0);
          while (((char)uVar8 != '\n' && (((uint)uVar8 & 0xff) != 0x20))) {
            bVar2 = *pbVar13;
            pbVar13 = pbVar13 + 1;
            uVar8 = (ulong)bVar2;
          }
          pbVar13[-1] = 0;
          read_from_file(pcVar14);
        }
        else {
          iVar7 = strncmp(pcVar11,"%define ",8);
          if (iVar7 != 0) {
            if (Eflag == 0) {
              cptr = pcVar11;
              return pcVar11;
            }
            printf("YPP: %s",pcVar11);
            cptr = line;
            return line;
          }
          for (uVar8 = 0; (cVar1 = pcVar11[uVar8 + 8], cVar1 != '\n' && (cVar1 != ' '));
              uVar8 = uVar8 + 1) {
            local_88[uVar8] = cVar1;
          }
          local_88[uVar8 & 0xffffffff] = '\0';
          ppcVar16 = defd_vars;
          if (defd_vars[0] != (char *)0x0) {
            ppcVar16 = defd_vars;
            pcVar11 = defd_vars[0];
            do {
              iVar7 = strcmp(pcVar11,local_88);
              if (iVar7 == 0) {
                error(input_file->lineno,(char *)0x0,(char *)0x0,
                      "Preprocessor variable %s already defined",local_88);
              }
              pcVar11 = ppcVar16[1];
              ppcVar16 = ppcVar16 + 1;
            } while (pcVar11 != (char *)0x0);
          }
          sVar10 = strlen(local_88);
          pcVar11 = (char *)malloc((ulong)((int)sVar10 + 1));
          *ppcVar16 = pcVar11;
          strcpy(pcVar11,local_88);
          ppcVar16[1] = (char *)0x0;
        }
      }
      goto LAB_001129bf;
    }
    ppuVar12 = __ctype_b_loc();
    pcVar14 = pcVar11 + 6;
    pbVar5 = (byte *)(pcVar11 + 8);
    do {
      pbVar13 = pbVar5;
      uVar8 = (ulong)pcVar14[1];
      pcVar14 = pcVar14 + 1;
      pbVar5 = pbVar13 + 1;
    } while ((*(byte *)((long)*ppuVar12 + uVar8 * 2 + 1) & 0x20) != 0);
    while (((char)uVar8 != '\n' && (((uint)uVar8 & 0xff) != 0x20))) {
      bVar2 = *pbVar13;
      pbVar13 = pbVar13 + 1;
      uVar8 = (ulong)bVar2;
    }
    pbVar13[-1] = 0;
    if ((ifdef == (ifdef_state *)0x0) || (ifdef->state == 0)) {
      piVar9 = (ifdef_state *)allocate(0x20);
      piVar9->next = ifdef;
      pfVar4 = input_file;
      piVar9->file = input_file;
      piVar9->lineno = pfVar4->lineno;
      cVar1 = line[3];
      piVar9->state = (uint)(cVar1 != 'n');
      piVar9->nested = 0;
      ifdef = piVar9;
      if (defd_vars[0] != (char *)0x0) {
        ppcVar16 = defd_vars;
        pcVar11 = defd_vars[0];
        do {
          ppcVar16 = ppcVar16 + 1;
          iVar7 = strcmp(pcVar11,pcVar14);
          if (iVar7 == 0) {
            piVar9->state = cVar1 != 'n' ^ 1;
            break;
          }
          pcVar11 = *ppcVar16;
        } while (pcVar11 != (char *)0x0);
      }
    }
    else {
      ifdef->nested = ifdef->nested + 1;
    }
  } while( true );
}

Assistant:

char *get_line() {
  extern int Eflag;
  int c;
  int i;

 NextLine:;
  i = 0;

  if (saw_eof || (c = getc(input_file->file)) == EOF) {

    /* end of current file */
    if (input_file->next) {
      void *t = input_file;
      while (ifdef && ifdef->file == input_file) {
	void *t1 = ifdef;
	error(ifdef->lineno, 0, 0, "No %%endif for %%if");
	ifdef = ifdef->next;
	FREE(t1); }
      fclose(input_file->file);
      FREE(input_file->name);
      input_file = input_file->next;
      FREE(t);
      goto NextLine;
    }

    if (line) FREE(line);
    saw_eof = 1;
    return line = cptr = 0;
  }
  if (line == 0 || linesize != (LINESIZE + 1)) {
    if (line) FREE(line);
    linesize = LINESIZE + 1;
    if (!(line = MALLOC(linesize))) no_space();
  }
  ++input_file->lineno;
  while ((line[i] = c) != '\n') {
    if (++i + 1 >= linesize)
      if (!(line = REALLOC(line, linesize += LINESIZE)))
	no_space();
    if ((c = getc(input_file->file)) == EOF) {
      c = '\n';
      saw_eof = 1;
    }
  }
  line[i+1] = 0;

  /* VM: process %ifdef/%ifndef line */
  if (!strncmp(&line[0], "%ifdef ", 7) || !strncmp(&line[0], "%ifndef ", 8)) {
    char *var_name = line + 7;
    char **ps;
    while (isspace(*var_name)) var_name++;
    for(i=0; var_name[i]!='\n' && var_name[i]!=' '; i++);
    var_name[i] = 0;
    if (ifdef && ifdef->state) {
      ifdef->nested++;
    } else {
      struct ifdef_state *n = NEW(struct ifdef_state);
      n->next = ifdef;
      n->file = input_file;
      n->lineno = input_file->lineno;
      n->state = line[3] != 'n';
      n->nested = 0;
      ifdef = n;
      /* Find the preprocessor variable */
      for(ps=&defd_vars[0]; *ps; ps++) {
	if(strcmp(*ps,var_name)==0) {
	  n->state ^= 1;
	  break;
	}
      }
    }
    goto NextLine;
  }

  /* VM: process %endif line */
  if(strncmp(&line[0], "%endif", 6)==0) {
    if(!ifdef || ifdef->file != input_file) {
      error(input_file->lineno, 0, 0, "There is no corresponding %%ifdef for %%endif");
    } else {
      if (ifdef->nested)
	ifdef->nested--;
      else {
	void *t = ifdef;
	ifdef = ifdef->next;
	FREE(t);
      }
    }
    goto NextLine;
  }

  /* VM: skip ordinary lines if ordered by %endif */
  if (ifdef && ifdef->state) {
    goto NextLine;
  }

  /* VM: Process %include line */
  if(strncmp(&line[0], "%include ", 9)==0) {
    char *name = line+9;
    while (isspace(*name)) name++;
    for(i=0; name[i]!='\n' && name[i]!=' '; i++);
    name[i] = 0;
    read_from_file(name);
    goto NextLine;
  }

  /* VM: process %define line */
  if(strncmp(&line[0], "%define ", 8)==0) {
    char var_name[80];
    int ii=0;
    char **ps;
    for(i=8; line[i]!='\n' && line[i]!=' '; i++, ii++) {
      var_name[ii] = line[i];
    }
    var_name[ii] = 0;
    /* Find the preprocessor variable */
    for(ps=&defd_vars[0]; *ps; ps++) {
      if(strcmp(*ps,var_name)==0) {
	error(input_file->lineno, 0, 0, "Preprocessor variable %s already defined", var_name);
      }
    }
    *ps = MALLOC(strlen(var_name)+1);
    strcpy(*ps, var_name);
    *++ps = NULL;
    goto NextLine;
  }

  if(Eflag) {
    printf("YPP: %s", line);
  }

  return cptr = line;
}